

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

bool tinyformat::detail::parseWidthOrPrecision
               (int *n,char **c,bool positionalMode,FormatArg *args,int *argIndex,int numArgs)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  format_error *pfVar5;
  long in_FS_OFFSET;
  allocator<char> local_49;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = **c;
  if ((byte)(cVar1 - 0x30U) < 10) {
    iVar3 = parseIntAndAdvance(c);
LAB_001169f4:
    *n = iVar3;
LAB_001169f6:
    bVar2 = true;
  }
  else {
    if (cVar1 == '*') {
      *c = *c + 1;
      *n = 0;
      if (!positionalMode) {
        iVar3 = *argIndex;
        if (numArgs <= iVar3) {
          pfVar5 = (format_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_48,
                     "tinyformat: Not enough arguments to read variable width or precision",
                     &local_49);
          format_error::format_error(pfVar5,&local_48);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            __cxa_throw(pfVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00116bfc;
        }
        *argIndex = iVar3 + 1;
        iVar3 = FormatArg::toInt(args + iVar3);
        goto LAB_001169f4;
      }
      uVar4 = parseIntAndAdvance(c);
      if (**c != '$') {
        pfVar5 = (format_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,
                   "tinyformat: Non-positional argument used after a positional one",&local_49);
        format_error::format_error(pfVar5,&local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pfVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00116bfc;
      }
      if (((int)uVar4 < 1) || (numArgs < (int)uVar4)) {
        pfVar5 = (format_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"tinyformat: Positional argument out of range",&local_49);
        format_error::format_error(pfVar5,&local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pfVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00116bfc;
      }
      iVar3 = FormatArg::toInt(args + ((ulong)uVar4 - 1));
      *n = iVar3;
      *c = *c + 1;
      goto LAB_001169f6;
    }
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
LAB_00116bfc:
  __stack_chk_fail();
}

Assistant:

inline bool parseWidthOrPrecision(int& n, const char*& c, bool positionalMode,
                                  const detail::FormatArg* args,
                                  int& argIndex, int numArgs)
{
    if (*c >= '0' && *c <= '9') {
        n = parseIntAndAdvance(c);
    }
    else if (*c == '*') {
        ++c;
        n = 0;
        if (positionalMode) {
            int pos = parseIntAndAdvance(c) - 1;
            if (*c != '$')
                TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
            if (pos >= 0 && pos < numArgs)
                n = args[pos].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
        }
        else {
            if (argIndex < numArgs)
                n = args[argIndex++].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable width or precision");
        }
    }
    else {
        return false;
    }
    return true;
}